

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

JavascriptString * __thiscall Js::JavascriptFunction::GetDisplayNameImpl(JavascriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  FunctionProxy *pFVar3;
  undefined4 *puVar4;
  ParseableFunctionInfo *this_00;
  char16 *name;
  JavascriptString *pJVar5;
  charcount_t local_1c [2];
  charcount_t length;
  
  pFVar3 = GetFunctionProxy(this);
  if (pFVar3 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xc86,"(this->GetFunctionProxy() != nullptr)",
                                "this->GetFunctionProxy() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pFVar3 = GetFunctionProxy(this);
  this_00 = FunctionProxy::EnsureDeserialized(pFVar3);
  local_1c[0] = 0;
  name = FunctionProxy::GetShortDisplayName(&this_00->super_FunctionProxy,local_1c);
  pJVar5 = DisplayNameHelper(this,name,local_1c[0]);
  return pJVar5;
}

Assistant:

JavascriptString* JavascriptFunction::GetDisplayNameImpl() const
    {
        Assert(this->GetFunctionProxy() != nullptr); // The caller should guarantee a proxy exists
        ParseableFunctionInfo * func = this->GetFunctionProxy()->EnsureDeserialized();
        charcount_t length = 0;
        const char16* name = func->GetShortDisplayName(&length);

        return DisplayNameHelper(name, length);
    }